

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

void __thiscall
pstore::small_vector<pstore::command_line::literal,_3UL>::~small_vector
          (small_vector<pstore::command_line::literal,_3UL> *this)

{
  std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>::
  ~vector(&this->big_buffer_);
  std::array<pstore::command_line::literal,_3UL>::~array(&this->small_buffer_);
  return;
}

Assistant:

~small_vector () noexcept = default;